

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O2

int net_udp4_send_socket(char *hostname,unsigned_short port,uchar ttl)

{
  int iVar1;
  int iVar2;
  char *__s;
  sockaddr_in saddr;
  
  iVar1 = net_ip4_resolve_hostname(hostname,port,(uchar *)0x0,&saddr);
  if ((iVar1 != 0) && (iVar1 = net_udp4_socket(&saddr,port,ttl), -1 < iVar1)) {
    if ((saddr.sin_addr.s_addr == 0xffffffff) &&
       (iVar2 = setsockopt(iVar1,1,6,&net_udp4_send_socket::allow,4), iVar2 == -1)) {
      __s = "setsockopt";
    }
    else {
      iVar2 = connect(iVar1,(sockaddr *)&saddr,0x10);
      if (-1 < iVar2) {
        return iVar1;
      }
      __s = "connect";
    }
    perror(__s);
    iVar1 = close(iVar1);
    if (iVar1 < 0) {
      perror("close");
    }
  }
  return -1;
}

Assistant:

int net_udp4_send_socket(char *hostname,
                         unsigned short port,
                         unsigned char ttl) {
  struct sockaddr_in saddr;
  if (!net_ip4_resolve_hostname(hostname, port, NULL, &saddr))
    return -1;

  /*M
    Create udp socket.
  **/
  int fd;
  if ((fd = net_udp4_socket(&saddr, port, ttl)) < 0)
    return -1;

  if (saddr.sin_addr.s_addr == INADDR_BROADCAST) {
    static int allow = 1;
    if (setsockopt(fd, SOL_SOCKET, SO_BROADCAST, (char*)&allow, sizeof(allow)) == -1) {
      perror("setsockopt");
      goto error;
    }
  }
  
  /*M
    Connect to hostname.
  **/
  if (connect(fd, (struct sockaddr *)&saddr, sizeof(saddr)) < 0) {
    perror("connect");
    goto error;
  }

  return fd;

 error:
  if (close(fd) < 0)
    perror("close");
  return -1;
}